

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_variable_temporary_copies(CompilerGLSL *this,SPIRVariable *var)

{
  ID *ts;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  const_iterator cVar1;
  SPIRType *type;
  Bitset *flags;
  __hashtable *__h;
  char (*in_R8) [6];
  __node_gen_type __node_gen;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  if (var->allocate_temporary_copy == true) {
    this_00 = &this->flushed_phi_variables;
    local_88._M_dataplus._M_p._0_4_ = (var->super_IVariant).self.id;
    cVar1 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this_00->_M_h,(key_type *)&local_88);
    if (cVar1.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      ts = &(var->super_IVariant).self;
      type = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&(var->super_IVariant).field_0xc);
      flags = Compiler::get_decoration_bitset
                        (&this->super_Compiler,(ID)(var->super_IVariant).self.id);
      flags_to_qualifiers_glsl_abi_cxx11_(&local_88,this,type,flags);
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[6]>
                (&local_48,(spirv_cross *)0x2beef5,(char (*) [2])ts,
                 (TypedID<(spirv_cross::Types)0> *)0x2ba6ec,in_R8);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_68,this,type,&local_48,0);
      statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (this,&local_88,&local_68,(char (*) [2])0x2d3bdb);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_68._M_dataplus._M_p._4_4_,(uint32_t)local_68._M_dataplus._M_p) !=
          &local_68.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_68._M_dataplus._M_p._4_4_,(uint32_t)local_68._M_dataplus._M_p
                                ));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      local_68._M_dataplus._M_p._0_4_ = ts->id;
      local_88._M_dataplus._M_p = (pointer)this_00;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)this_00);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_variable_temporary_copies(const SPIRVariable &var)
{
	// Ensure that we declare phi-variable copies even if the original declaration isn't deferred
	if (var.allocate_temporary_copy && !flushed_phi_variables.count(var.self))
	{
		auto &type = get<SPIRType>(var.basetype);
		auto &flags = get_decoration_bitset(var.self);
		statement(flags_to_qualifiers_glsl(type, flags), variable_decl(type, join("_", var.self, "_copy")), ";");
		flushed_phi_variables.insert(var.self);
	}
}